

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_uqadd_s16_arm(CPUARMState *env,uint32_t a,uint32_t b)

{
  int32_t iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint64_t r;
  int32_t vr;
  int32_t vb;
  int32_t va;
  uint32_t b_local;
  uint32_t a_local;
  CPUARMState *env_local;
  
  iVar1 = sextract32(a,0,0x10);
  uVar2 = extract32(b,0,0x10);
  r._4_4_ = iVar1 + uVar2;
  if ((int)r._4_4_ < 0x10000) {
    if ((int)r._4_4_ < 0) {
      (env->vfp).qc[0] = 1;
      r._4_4_ = 0;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    r._4_4_ = 0xffff;
  }
  uVar2 = deposit32(0,0,0x10,r._4_4_);
  iVar1 = sextract32(a,0x10,0x10);
  uVar3 = extract32(b,0x10,0x10);
  r._4_4_ = iVar1 + uVar3;
  if ((int)r._4_4_ < 0x10000) {
    if ((int)r._4_4_ < 0) {
      (env->vfp).qc[0] = 1;
      r._4_4_ = 0;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    r._4_4_ = 0xffff;
  }
  uVar2 = deposit32(uVar2,0x10,0x10,r._4_4_);
  return uVar2;
}

Assistant:

uint32_t HELPER(neon_uqadd_s16)(CPUARMState *env, uint32_t a, uint32_t b)
{
    int32_t va, vb, vr;
    uint64_t r = 0;

    USATACC(16, 0);
    USATACC(16, 16);
    return r;
}